

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_29dc6::der_operators_log_e_Test::TestBody(der_operators_log_e_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_5;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_4;
  double x;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_3;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_2;
  Message local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_40 [3];
  Message local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  der_operators_log_e_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  dVar3 = dnet::derivative::op_ln<dnet::derivative::variant>::f(1.0);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_20,"f::f(1.0f)","0.0f",(float)dVar3,0.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(local_40,&local_28);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    testing::Message::~Message(&local_28);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    dVar3 = dnet::derivative::op_ln<dnet::derivative::variant>::d(1.0);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)local_58,"f::d(1.0f)","1.0f",(float)dVar3,1.0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
    if (!bVar1) {
      testing::Message::Message(&local_60);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                 ,0x5f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_60);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      dVar3 = dnet::derivative::op_ln<dnet::derivative::variant>::d(10.0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)local_78,"f::d(10.0f)","0.1f",(float)dVar3,0.1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
      if (!bVar1) {
        testing::Message::Message(&local_80);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                   ,0x60,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_80);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_80);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        dVar3 = dnet::derivative::
                op_div<dnet::derivative::op_ln<dnet::derivative::variant>,_dnet::derivative::op_ln<dnet::derivative::constant<(anonymous_namespace)::E>_>_>
                ::d(10.0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)local_98,"g::d(10.0f)","0.1f",(float)dVar3,0.1);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
        if (!bVar1) {
          testing::Message::Message(&local_a0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&x,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                     ,0x61,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&x,&local_a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&x);
          testing::Message::~Message(&local_a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
        for (gtest_ar_4.message_.ptr_ =
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0x3fb999999999999a; (double)gtest_ar_4.message_.ptr_ < 10.0;
            gtest_ar_4.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (gtest_ar_4.message_.ptr_ + 0.1)) {
          dVar3 = dnet::derivative::op_ln<dnet::derivative::variant>::f
                            ((double)gtest_ar_4.message_.ptr_);
          dVar4 = dnet::derivative::
                  op_div<dnet::derivative::op_ln<dnet::derivative::variant>,_dnet::derivative::op_ln<dnet::derivative::constant<(anonymous_namespace)::E>_>_>
                  ::f((double)gtest_ar_4.message_.ptr_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_c0,"f::f(x)","g::f(x)",(float)dVar3,(float)dVar4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
          if (!bVar1) {
            testing::Message::Message(&local_c8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                       ,100,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
          dVar3 = dnet::derivative::op_ln<dnet::derivative::variant>::d
                            ((double)gtest_ar_4.message_.ptr_);
          dVar4 = dnet::derivative::
                  op_div<dnet::derivative::op_ln<dnet::derivative::variant>,_dnet::derivative::op_ln<dnet::derivative::constant<(anonymous_namespace)::E>_>_>
                  ::d((double)gtest_ar_4.message_.ptr_);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_e0,"f::d(x)","g::d(x)",(float)dVar3,(float)dVar4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
          if (!bVar1) {
            testing::Message::Message(&local_e8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                       ,0x65,pcVar2);
            testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            testing::Message::~Message(&local_e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(der_operators, log_e)
    {
        // y = lnx
        // dy/dx = 1/x
        typedef op_ln<variant> f;
        typedef op_div<op_ln<variant>, op_ln<constant<E>>> g;
        ASSERT_FLOAT_EQ(f::f(1.0f), 0.0f);
        ASSERT_FLOAT_EQ(f::d(1.0f), 1.0f);
        ASSERT_FLOAT_EQ(f::d(10.0f), 0.1f);
        EXPECT_FLOAT_EQ(g::d(10.0f), 0.1f);
        for (double x = 0.1; x < 10.0; x += 0.1)
        {
            EXPECT_FLOAT_EQ(f::f(x), g::f(x));
            EXPECT_FLOAT_EQ(f::d(x), g::d(x));
        }
    }